

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

void __thiscall wasm::InstrumentMemory::visitStructSet(InstrumentMemory *this,StructSet *curr)

{
  Index x;
  initializer_list<wasm::Expression_*> __l;
  Name target_00;
  bool bVar1;
  Module *wasm;
  Call *pCVar2;
  allocator<wasm::Expression_*> local_91;
  Const *local_90;
  Expression *local_88;
  Const **local_80;
  size_type local_78;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_70;
  size_t local_58;
  char *pcStack_50;
  BasicType local_40 [4];
  undefined1 auStack_30 [8];
  Name target;
  Builder builder;
  StructSet *curr_local;
  InstrumentMemory *this_local;
  
  wasm = Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::getModule
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
                     ).
                     super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                     .
                     super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                   );
  Builder::Builder((Builder *)&target.super_IString.str._M_str,wasm);
  wasm::Name::Name((Name *)auStack_30);
  local_40[3] = 2;
  bVar1 = wasm::Type::operator==(&curr->value->type,local_40 + 3);
  if (bVar1) {
    wasm::Name::operator=((Name *)auStack_30,(Name *)&struct_set_val_i32);
  }
  else {
    local_40[2] = 3;
    bVar1 = wasm::Type::operator==(&curr->value->type,local_40 + 2);
    if (bVar1) {
      wasm::Name::operator=((Name *)auStack_30,(Name *)&struct_set_val_i64);
    }
    else {
      local_40[1] = 4;
      bVar1 = wasm::Type::operator==(&curr->value->type,local_40 + 1);
      if (bVar1) {
        wasm::Name::operator=((Name *)auStack_30,(Name *)&struct_set_val_f32);
      }
      else {
        local_40[0] = f64;
        bVar1 = wasm::Type::operator==(&curr->value->type,local_40);
        if (!bVar1) {
          return;
        }
        wasm::Name::operator=((Name *)auStack_30,(Name *)&struct_set_val_f64);
      }
    }
  }
  local_58 = (size_t)auStack_30;
  pcStack_50 = (char *)target.super_IString.str._M_len;
  x = this->id;
  this->id = x + 1;
  local_90 = Builder::makeConst<int>((Builder *)&target.super_IString.str._M_str,x);
  local_88 = curr->value;
  local_80 = &local_90;
  local_78 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_91);
  __l._M_len = local_78;
  __l._M_array = (iterator)local_80;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_70,__l,&local_91);
  target_00.super_IString.str._M_str = pcStack_50;
  target_00.super_IString.str._M_len = local_58;
  pCVar2 = Builder::makeCall((Builder *)&target.super_IString.str._M_str,target_00,&local_70,
                             (Type)(curr->value->type).id,false);
  curr->value = (Expression *)pCVar2;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_70);
  std::allocator<wasm::Expression_*>::~allocator(&local_91);
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
    Builder builder(*getModule());
    Name target;
    if (curr->value->type == Type::i32) {
      target = struct_set_val_i32;
    } else if (curr->value->type == Type::i64) {
      target = struct_set_val_i64;
    } else if (curr->value->type == Type::f32) {
      target = struct_set_val_f32;
    } else if (curr->value->type == Type::f64) {
      target = struct_set_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    curr->value =
      builder.makeCall(target,
                       {builder.makeConst(int32_t(id++)), curr->value},
                       curr->value->type);
  }